

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

void IDASensPredict(IDAMem IDA_mem,N_Vector *yySens,N_Vector *ypSens)

{
  int iVar1;
  long lVar2;
  
  iVar1 = IDA_mem->ida_kk;
  for (lVar2 = 0; lVar2 <= iVar1; lVar2 = lVar2 + 1) {
    IDA_mem->ida_cvals[lVar2] = 1.0;
  }
  N_VLinearCombinationVectorArray
            (IDA_mem->ida_Ns,iVar1 + 1,IDA_mem->ida_cvals,IDA_mem->ida_phiS,yySens);
  N_VLinearCombinationVectorArray
            (IDA_mem->ida_Ns,IDA_mem->ida_kk,IDA_mem->ida_gamma + 1,IDA_mem->ida_phiS + 1,ypSens);
  return;
}

Assistant:

static void IDASensPredict(IDAMem IDA_mem, N_Vector* yySens, N_Vector* ypSens)
{
  int j;

  for (j = 0; j <= IDA_mem->ida_kk; j++) { IDA_mem->ida_cvals[j] = ONE; }

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk + 1,
                                        IDA_mem->ida_cvals, IDA_mem->ida_phiS,
                                        yySens);

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk,
                                        IDA_mem->ida_gamma + 1,
                                        IDA_mem->ida_phiS + 1, ypSens);
}